

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureTheFlag.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_45568::CtfBase::reset(CtfBase *this)

{
  OpenSteer::SimpleVehicle::reset(&this->super_SimpleVehicle);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1c])(0x40400000,this);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1f])(0x40400000,this);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x21])(0x40400000,this);
  this->avoiding = false;
  randomizeStartingPositionAndHeading(this);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  setTrailParameters((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                     this,(this->super_SimpleVehicle).super_SimpleVehicle_3.
                          super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                          .trailDuration,
                     (this->super_SimpleVehicle).super_SimpleVehicle_3.
                     super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
                     trailVertexCount);
  return;
}

Assistant:

void CtfBase::reset (void)
    {
        SimpleVehicle::reset ();  // reset the vehicle 

        setSpeed (3);             // speed along Forward direction.
        setMaxForce (3.0);        // steering force is clipped to this magnitude
        setMaxSpeed (3.0);        // velocity is clipped to this magnitude

        avoiding = false;         // not actively avoiding

        randomizeStartingPositionAndHeading ();  // new starting position

        clearTrailHistory ();     // prevent long streaks due to teleportation
    }